

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O1

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<bidfx_public_api::price::pixie::AckData>::Pop
          (iterator *__return_storage_ptr__,
          BlockingQueue<bidfx_public_api::price::pixie::AckData> *this)

{
  _Elt_pointer pAVar1;
  _Elt_pointer pAVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pAVar1 = (this->queue_).
           super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pAVar2 = (this->queue_).
           super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar2 == pAVar1) {
    __return_storage_ptr__->_M_cur = pAVar2;
    __return_storage_ptr__->_M_first =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    __return_storage_ptr__->_M_last =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    __return_storage_ptr__->_M_node =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
  }
  else {
    __return_storage_ptr__->_M_cur = pAVar1;
    __return_storage_ptr__->_M_first =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    __return_storage_ptr__->_M_last =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    __return_storage_ptr__->_M_node =
         (this->queue_).
         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    std::
    deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
    ::pop_front(&this->queue_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Pop()
    {
        std::unique_lock<std::mutex> lock(mutex_);

        if (queue_.empty())
        {
            return queue_.end();
        }

        auto element = queue_.begin();
        queue_.pop_front();
        return element;
    }